

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
::slot_array(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
             *this)

{
  slot_type *in_RAX;
  
  if (this == (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               *)0x1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x101b,
                  "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::slot_array() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if (this != (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
               *)0x0) {
    return in_RAX;
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
               );
}

Assistant:

slot_type* slot_array() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return static_cast<slot_type*>(common().slot_array());
  }